

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int aead_aesgcm_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key,size_t key_size)

{
  int extraout_EAX;
  code *pcVar1;
  code *pcVar2;
  aesgcm_context_t *ctx;
  code *pcVar3;
  code *pcVar4;
  
  _ctx->dispose_crypto = aesgcm_dispose_crypto;
  if (is_enc == 0) {
    pcVar1 = aesgcm_decrypt;
    pcVar2 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    pcVar4 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    pcVar3 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
  }
  else {
    pcVar3 = aesgcm_encrypt_final;
    pcVar4 = aesgcm_encrypt_update;
    pcVar2 = aesgcm_encrypt_init;
    pcVar1 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
              *)0x0;
  }
  _ctx->do_encrypt_init = pcVar2;
  _ctx->do_encrypt_update = pcVar4;
  _ctx->do_encrypt_final = pcVar3;
  _ctx->do_decrypt = pcVar1;
  cf_aes_init((cf_aes_context *)(_ctx + 1),(uint8_t *)key,key_size);
  return extraout_EAX;
}

Assistant:

static int aead_aesgcm_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, size_t key_size)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;

    ctx->super.dispose_crypto = aesgcm_dispose_crypto;
    if (is_enc) {
        ctx->super.do_encrypt_init = aesgcm_encrypt_init;
        ctx->super.do_encrypt_update = aesgcm_encrypt_update;
        ctx->super.do_encrypt_final = aesgcm_encrypt_final;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_decrypt = aesgcm_decrypt;
    }

    cf_aes_init(&ctx->aes, key, key_size);
    return 0;
}